

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O2

int __thiscall pbrt::SDVertex::valence(SDVertex *this)

{
  SDFace *pSVar1;
  int iVar2;
  
  pSVar1 = this->startFace;
  if (this->boundary == false) {
    iVar2 = 0;
    do {
      pSVar1 = SDFace::nextFace(pSVar1,this);
      iVar2 = iVar2 + 1;
    } while (pSVar1 != this->startFace);
  }
  else {
    iVar2 = 0;
    do {
      pSVar1 = SDFace::nextFace(pSVar1,this);
      iVar2 = iVar2 + 1;
    } while (pSVar1 != (SDFace *)0x0);
    pSVar1 = this->startFace;
    do {
      pSVar1 = SDFace::prevFace(pSVar1,this);
      iVar2 = iVar2 + 1;
    } while (pSVar1 != (SDFace *)0x0);
  }
  return iVar2;
}

Assistant:

inline int SDVertex::valence() {
    SDFace *f = startFace;
    if (!boundary) {
        // Compute valence of interior vertex
        int nf = 1;
        while ((f = f->nextFace(this)) != startFace)
            ++nf;
        return nf;
    } else {
        // Compute valence of boundary vertex
        int nf = 1;
        while ((f = f->nextFace(this)) != nullptr)
            ++nf;
        f = startFace;
        while ((f = f->prevFace(this)) != nullptr)
            ++nf;
        return nf + 1;
    }
}